

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

void write_at(ValueArray *value_array,uint64_t index,CrispyValue value)

{
  CrispyValue *pCVar1;
  uint64_t local_38;
  CrispyValue *temp;
  uint64_t index_local;
  ValueArray *value_array_local;
  CrispyValue value_local;
  
  while (value_array->cap <= index) {
    if (value_array->cap < 8) {
      local_38 = 8;
    }
    else {
      local_38 = value_array->cap << 1;
    }
    value_array->cap = local_38;
    pCVar1 = (CrispyValue *)calloc(value_array->cap,0x10);
    memcpy(pCVar1,value_array->values,value_array->count << 4);
    free(value_array->values);
    value_array->values = pCVar1;
  }
  if (value_array->count < index) {
    value_array->count = index + 1;
  }
  else if (index == value_array->count) {
    value_array->count = value_array->count + 1;
  }
  pCVar1 = value_array->values;
  *(ulong *)(pCVar1 + index) = CONCAT44(value_array_local._4_4_,value.type);
  pCVar1[index].field_1.p_value = (uint64_t)value.field_1;
  return;
}

Assistant:

void write_at(ValueArray *value_array, uint64_t index, CrispyValue value) {
    while (index >= value_array->cap) {
        value_array->cap = GROW_CAP(value_array->cap);
        // value_array->values = GROW_ARR(value_array->values, CrispyValue, value_array->cap);
        CrispyValue *temp = calloc(value_array->cap, sizeof(CrispyValue));
        memcpy(temp, value_array->values, value_array->count * sizeof(CrispyValue));
        free(value_array->values);
        value_array->values = temp;
    }

    if (index > value_array->count) {
        value_array->count = index + 1;
    } else if (index == value_array->count) {
        ++value_array->count;
    }

    value_array->values[index] = value;
}